

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Integer lua_tointegerx(lua_State *L,int idx,int *ok)

{
  TValue TVar1;
  int iVar2;
  TValue *pTVar3;
  lua_Integer lVar4;
  TValue tmp;
  TValue local_10;
  
  pTVar3 = index2adr(L,idx);
  TVar1 = (TValue)pTVar3->n;
  if (((ulong)(TVar1.it64 >> 0x2f) < 0xfffffffffffffff2) ||
     ((TVar1.it64 >> 0x2f == 0xfffffffffffffffb &&
      (iVar2 = lj_strscan_num((GCstr *)(TVar1.u64 & 0x7fffffffffff),&local_10), TVar1 = local_10,
      iVar2 != 0)))) {
    if (ok != (int *)0x0) {
      *ok = 1;
    }
    lVar4 = (lua_Integer)TVar1.n;
  }
  else {
    if (ok != (int *)0x0) {
      *ok = 0;
    }
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

LUA_API lua_Integer lua_tointegerx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    if (ok) *ok = 1;
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp))) {
      if (ok) *ok = 0;
      return 0;
    }
    if (tvisint(&tmp)) {
      if (ok) *ok = 1;
      return intV(&tmp);
    }
    n = numV(&tmp);
  }
  if (ok) *ok = 1;
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}